

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O3

void __thiscall xercesc_4_0::ReaderMgr::skipPastSpaces(ReaderMgr *this)

{
  bool bVar1;
  bool tmpFlag;
  bool local_11;
  
  do {
    bVar1 = XMLReader::skipSpaces(this->fCurReader,&local_11,false);
    if (bVar1) {
      return;
    }
    bVar1 = popReader(this);
  } while (bVar1);
  return;
}

Assistant:

void ReaderMgr::skipPastSpaces()
{
    // we are not using it, so we don't care to initialize it
    bool tmpFlag;
    //
    //  Skip all the spaces in the current reader. If it returned because
    //  it hit a non-space, break out. Else we have to pop another entity
    //  and keep going.
    //
    while (!fCurReader->skipSpaces(tmpFlag, false))
    {
        // Try to pop another entity. If we can't then we are done
        if (!popReader())
            break;
    }
}